

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::GetRegisteredGenerators
          (cmake *this,
          vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators,
          bool includeNamesWithPlatform)

{
  pointer ppcVar1;
  cmGlobalGeneratorFactory *pcVar2;
  pointer ppcVar3;
  cmExternalMakefileProjectGeneratorFactory *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int iVar5;
  pointer ppcVar6;
  _Alloc_hider _Var7;
  string *a;
  pointer pbVar8;
  pointer pbVar9;
  pointer ppcVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namesWithPlatform;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_130 [32];
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined2 local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  bool local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  ppcVar1 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar10 = (this->Generators).
                  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppcVar10 != ppcVar1;
      ppcVar10 = ppcVar10 + 1) {
    pcVar2 = *ppcVar10;
    (*pcVar2->_vptr_cmGlobalGeneratorFactory[4])(&local_70,pcVar2);
    _Var7._M_p = local_70._M_dataplus._M_p;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_70._M_string_length;
    if (includeNamesWithPlatform) {
      (*pcVar2->_vptr_cmGlobalGeneratorFactory[5])((GeneratorInfo *)local_130,pcVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_70,
                 (const_iterator)local_70._M_string_length,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_130._0_8_,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_130._8_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_130);
      _Var7._M_p = local_70._M_dataplus._M_p;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_70._M_string_length;
    }
    for (; (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var7._M_p != pbVar4
        ; _Var7._M_p = (pointer)((long)_Var7._M_p + 0x20)) {
      local_130._0_8_ = local_130 + 0x10;
      local_130._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_130[0x10] = '\0';
      local_110._M_p = (pointer)&local_100;
      local_108 = 0;
      local_100._M_local_buf[0] = '\0';
      local_f0._M_p = (pointer)&local_e0;
      local_e8 = 0;
      local_e0._M_local_buf[0] = '\0';
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0._M_p = (pointer)&local_a0;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      iVar5 = (*pcVar2->_vptr_cmGlobalGeneratorFactory[6])(pcVar2);
      local_d0._0_1_ = SUB41(iVar5,0);
      iVar5 = (*pcVar2->_vptr_cmGlobalGeneratorFactory[7])(pcVar2);
      local_d0._1_1_ = SUB41(iVar5,0);
      (*pcVar2->_vptr_cmGlobalGeneratorFactory[8])(&local_50,pcVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_c8,&local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_50);
      (*pcVar2->_vptr_cmGlobalGeneratorFactory[9])(&local_50,pcVar2);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::_M_assign((string *)local_130);
      std::__cxx11::string::_M_assign((string *)(local_130 + 0x20));
      local_90 = false;
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::
      emplace_back<cmake::GeneratorInfo>(generators,(GeneratorInfo *)local_130);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_130);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_70);
  }
  ppcVar3 = (this->ExtraGenerators).
            super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar6 = (this->ExtraGenerators).
                 super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar3;
      ppcVar6 = ppcVar6 + 1) {
    this_00 = *ppcVar6;
    cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
              (&local_88,this_00);
    pbVar9 = local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar8 = local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar9; pbVar8 = pbVar8 + 1)
    {
      local_130._0_8_ = local_130 + 0x10;
      local_130._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_130[0x10] = '\0';
      local_110._M_p = (pointer)&local_100;
      local_108 = 0;
      local_100._M_local_buf[0] = '\0';
      local_f0._M_p = (pointer)&local_e0;
      local_e8 = 0;
      local_e0._M_local_buf[0] = '\0';
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_b0._M_p = (pointer)&local_a0;
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_70,this_00);
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_50,pbVar8,&local_70);
      std::__cxx11::string::operator=((string *)local_130,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::_M_assign((string *)(local_130 + 0x20));
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,this_00);
      std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      local_d0._0_1_ = false;
      local_d0._1_1_ = false;
      local_90 = false;
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::
      emplace_back<cmake::GeneratorInfo>(generators,(GeneratorInfo *)local_130);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_130);
    }
    pbVar8 = (this_00->Aliases).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar9 = (this_00->Aliases).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar8; pbVar9 = pbVar9 + 1)
    {
      local_130._0_8_ = local_130 + 0x10;
      local_130._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_130[0x10] = '\0';
      local_110._M_p = (pointer)&local_100;
      local_108 = 0;
      local_100._M_local_buf[0] = '\0';
      local_f0._M_p = (pointer)&local_e0;
      local_e8 = 0;
      local_e0._M_local_buf[0] = '\0';
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_b0._M_p = (pointer)&local_a0;
      std::__cxx11::string::_M_assign((string *)local_130);
      if (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::at(&local_88,0);
        std::__cxx11::string::_M_assign((string *)(local_130 + 0x20));
      }
      cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_50,this_00);
      std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      local_d0._0_1_ = false;
      local_d0._1_1_ = false;
      local_90 = true;
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::
      emplace_back<cmake::GeneratorInfo>(generators,(GeneratorInfo *)local_130);
      GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_130);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  return;
}

Assistant:

void cmake::GetRegisteredGenerators(std::vector<GeneratorInfo>& generators,
                                    bool includeNamesWithPlatform) const
{
  for (cmGlobalGeneratorFactory* gen : this->Generators) {
    std::vector<std::string> names = gen->GetGeneratorNames();

    if (includeNamesWithPlatform) {
      std::vector<std::string> namesWithPlatform =
        gen->GetGeneratorNamesWithPlatform();
      names.insert(names.end(), namesWithPlatform.begin(),
                   namesWithPlatform.end());
    }

    for (std::string const& name : names) {
      GeneratorInfo info;
      info.supportsToolset = gen->SupportsToolset();
      info.supportsPlatform = gen->SupportsPlatform();
      info.supportedPlatforms = gen->GetKnownPlatforms();
      info.defaultPlatform = gen->GetDefaultPlatformName();
      info.name = name;
      info.baseName = name;
      info.isAlias = false;
      generators.push_back(std::move(info));
    }
  }

  for (cmExternalMakefileProjectGeneratorFactory* eg : this->ExtraGenerators) {
    const std::vector<std::string> genList =
      eg->GetSupportedGlobalGenerators();
    for (std::string const& gen : genList) {
      GeneratorInfo info;
      info.name = cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
        gen, eg->GetName());
      info.baseName = gen;
      info.extraName = eg->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = false;
      generators.push_back(std::move(info));
    }
    for (std::string const& a : eg->Aliases) {
      GeneratorInfo info;
      info.name = a;
      if (!genList.empty()) {
        info.baseName = genList.at(0);
      }
      info.extraName = eg->GetName();
      info.supportsPlatform = false;
      info.supportsToolset = false;
      info.isAlias = true;
      generators.push_back(std::move(info));
    }
  }
}